

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_alloc_cdef_buffers
               (AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync,
               int num_workers,int init_worker)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  SequenceHeader *pSVar5;
  bool bVar6;
  uint16_t *puVar7;
  AV1CdefWorkerData *pAVar8;
  void *pvVar9;
  AV1CdefRowSync *pAVar10;
  byte bVar11;
  int plane_2;
  uint uVar12;
  pthread_mutex_t *ppVar13;
  pthread_cond_t *ppVar14;
  ulong uVar15;
  uint uVar16;
  int plane;
  long lVar17;
  int plane_1;
  ulong num;
  long lVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  size_t new_colbuf_size [3];
  size_t new_linebuf_size [3];
  size_t local_b8;
  int local_a8;
  size_t local_78 [4];
  size_t local_58 [3];
  size_t *local_40;
  ulong local_38;
  
  num = (ulong)(uint)num_workers;
  pSVar5 = cm->seq_params;
  local_58[2] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_78[2] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  iVar2 = (cm->mi_params).mi_rows;
  iVar3 = iVar2 + 0xf;
  iVar2 = iVar2 + 0x1e;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  uVar16 = (uint)(pSVar5->monochrome == '\0') * 2 + 1;
  local_38 = (ulong)(uint)(iVar2 >> 4);
  if (pSVar5->enable_cdef != '\0') {
    lVar17 = 0x60;
    if (1 < num_workers) {
      lVar17 = (long)(iVar2 >> 4) << 5;
    }
    bVar21 = (cm->tiles).single_tile_decoding == 0;
    if (bVar21) {
      iVar3 = (cm->mi_params).mi_cols;
      uVar15 = 0;
      do {
        bVar11 = 0;
        if (uVar15 != 0) {
          bVar11 = (byte)pSVar5->subsampling_x;
        }
        local_58[uVar15] = ((int)(iVar3 * 4 + 0xfU & 0xfffffff0) >> (bVar11 & 0x1f)) * lVar17;
        local_78[uVar15] = (long)(0x100 << (2 - bVar11 & 0x1f)) << 4;
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      local_b8 = 0x9480;
      goto LAB_00384596;
    }
  }
  bVar21 = false;
  local_b8 = 0;
LAB_00384596:
  iVar3 = (cm->cdef_info).allocated_num_workers;
  local_40 = (cm->cdef_info).allocated_linebuf_size;
  lVar17 = 0;
  do {
    if (local_58[lVar17] != (cm->cdef_info).allocated_linebuf_size[lVar17]) {
      aom_free((cm->cdef_info).linebuf[lVar17]);
      (cm->cdef_info).linebuf[lVar17] = (uint16_t *)0x0;
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if ((cm->cdef_info).allocated_srcbuf_size != local_b8) {
    aom_free((cm->cdef_info).srcbuf);
    (cm->cdef_info).srcbuf = (uint16_t *)0x0;
  }
  psVar1 = (cm->cdef_info).allocated_colbuf_size;
  lVar17 = 0;
  do {
    if (local_78[lVar17] != (cm->cdef_info).allocated_colbuf_size[lVar17]) {
      aom_free((cm->cdef_info).colbuf[lVar17]);
      (cm->cdef_info).colbuf[lVar17] = (uint16_t *)0x0;
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  pAVar8 = *cdef_worker;
  if (init_worker != 0 && pAVar8 != (AV1CdefWorkerData *)0x0) {
    if (iVar3 == num_workers) {
      if (1 < num_workers) {
        lVar17 = num * 0x1f8 + -0x1e8;
        uVar15 = num;
        do {
          uVar20 = uVar15 - 1;
          pAVar8 = *cdef_worker;
          if ((cm->cdef_info).allocated_srcbuf_size != local_b8) {
            aom_free(pAVar8[uVar20].srcbuf);
            pAVar8[uVar20].srcbuf = (uint16_t *)0x0;
          }
          lVar18 = 0;
          do {
            if (local_78[lVar18] != psVar1[lVar18]) {
              aom_free(*(void **)((long)pAVar8->colbuf + lVar18 * 8 + lVar17 + -0x10));
              *(undefined8 *)((long)pAVar8->colbuf + lVar18 * 8 + lVar17 + -0x10) = 0;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar17 = lVar17 + -0x1f8;
          bVar6 = 2 < (long)uVar15;
          uVar15 = uVar20;
        } while (bVar6);
      }
    }
    else {
      lVar17 = (long)(cm->cdef_info).allocated_num_workers;
      if (1 < lVar17) {
        lVar18 = lVar17 * 0x1f8 + -0x1e8;
        do {
          pAVar8 = *cdef_worker;
          aom_free(pAVar8[lVar17 + -1].srcbuf);
          pAVar8[lVar17 + -1].srcbuf = (uint16_t *)0x0;
          lVar19 = 0;
          do {
            aom_free(*(void **)((long)pAVar8->colbuf + lVar19 * 8 + lVar18 + -0x10));
            *(undefined8 *)((long)pAVar8->colbuf + lVar19 * 8 + lVar18 + -0x10) = 0;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          lVar18 = lVar18 + -0x1f8;
          bVar6 = 2 < lVar17;
          lVar17 = lVar17 + -1;
        } while (bVar6);
        pAVar8 = *cdef_worker;
      }
      aom_free(pAVar8);
      *cdef_worker = (AV1CdefWorkerData *)0x0;
    }
  }
  uVar4 = (cm->cdef_info).allocated_mi_rows;
  uVar12 = (uint)local_38;
  if ((uVar4 != uVar12) && (pAVar10 = cdef_sync->cdef_row_mt, pAVar10 != (AV1CdefRowSync *)0x0)) {
    if (0 < (int)uVar4) {
      lVar17 = 0;
      do {
        pAVar10 = cdef_sync->cdef_row_mt;
        ppVar13 = *(pthread_mutex_t **)((long)&pAVar10->row_mutex_ + lVar17);
        if (ppVar13 != (pthread_mutex_t *)0x0) {
          pthread_mutex_destroy(ppVar13);
          aom_free(*(void **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar17));
          pAVar10 = cdef_sync->cdef_row_mt;
        }
        ppVar14 = *(pthread_cond_t **)((long)&pAVar10->row_cond_ + lVar17);
        if (ppVar14 != (pthread_cond_t *)0x0) {
          pthread_cond_destroy(ppVar14);
          aom_free(*(void **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar17));
        }
        lVar17 = lVar17 + 0x18;
      } while ((ulong)uVar4 * 0x18 != lVar17);
      pAVar10 = cdef_sync->cdef_row_mt;
    }
    aom_free(pAVar10);
    cdef_sync->cdef_row_mt = (AV1CdefRowSync *)0x0;
  }
  (cm->cdef_info).allocated_srcbuf_size = local_b8;
  (cm->cdef_info).allocated_colbuf_size[2] = local_78[2];
  *psVar1 = local_78[0];
  (cm->cdef_info).allocated_colbuf_size[1] = local_78[1];
  local_40[2] = local_58[2];
  *local_40 = local_58[0];
  local_40[1] = local_58[1];
  (cm->cdef_info).allocated_mi_rows = uVar12;
  (cm->cdef_info).allocated_num_workers = num_workers;
  if (bVar21) {
    if ((cm->cdef_info).srcbuf == (uint16_t *)0x0) {
      puVar7 = (uint16_t *)aom_memalign(0x10,local_b8);
      (cm->cdef_info).srcbuf = puVar7;
      if (puVar7 == (uint16_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *srcbuf");
      }
    }
    uVar20 = (ulong)uVar16;
    uVar15 = 0;
    do {
      if ((cm->cdef_info).colbuf[uVar15] == (uint16_t *)0x0) {
        puVar7 = (uint16_t *)aom_malloc((cm->cdef_info).allocated_colbuf_size[uVar15]);
        (cm->cdef_info).colbuf[uVar15] = puVar7;
        if (puVar7 == (uint16_t *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate colbuf[plane]");
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar20 != uVar15);
    uVar15 = 0;
    do {
      if ((cm->cdef_info).linebuf[uVar15] == (uint16_t *)0x0) {
        puVar7 = (uint16_t *)aom_malloc((cm->cdef_info).allocated_linebuf_size[uVar15]);
        (cm->cdef_info).linebuf[uVar15] = puVar7;
        if (puVar7 == (uint16_t *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate linebuf[plane]");
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar20 != uVar15);
    if (1 < num_workers) {
      if (init_worker != 0) {
        if (*cdef_worker == (AV1CdefWorkerData *)0x0) {
          pAVar8 = (AV1CdefWorkerData *)aom_calloc(num,0x1f8);
          *cdef_worker = pAVar8;
          if (pAVar8 == (AV1CdefWorkerData *)0x0) {
            aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_worker");
          }
        }
        lVar17 = (ulong)(num_workers - 1) * 0x1f8 + 0x10;
        do {
          pAVar8 = *cdef_worker;
          uVar15 = num - 1 & 0xffffffff;
          if (pAVar8[uVar15].srcbuf == (uint16_t *)0x0) {
            puVar7 = (uint16_t *)aom_memalign(0x10,(cm->cdef_info).allocated_srcbuf_size);
            pAVar8[uVar15].srcbuf = puVar7;
            if (puVar7 == (uint16_t *)0x0) {
              aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *srcbuf");
            }
          }
          uVar15 = 0;
          do {
            if (*(long *)((long)pAVar8->colbuf + uVar15 * 8 + lVar17 + -0x10) == 0) {
              pvVar9 = aom_malloc(psVar1[uVar15]);
              *(void **)((long)pAVar8->colbuf + uVar15 * 8 + lVar17 + -0x10) = pvVar9;
              if (pvVar9 == (void *)0x0) {
                aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate colbuf[plane]")
                ;
              }
            }
            uVar15 = uVar15 + 1;
          } while (uVar20 != uVar15);
          lVar17 = lVar17 + -0x1f8;
          local_a8 = (int)num;
          num = num - 1;
        } while (2 < local_a8);
      }
      if (cdef_sync->cdef_row_mt == (AV1CdefRowSync *)0x0) {
        iVar3 = (cm->cdef_info).allocated_mi_rows;
        pAVar10 = (AV1CdefRowSync *)aom_calloc((long)iVar3,0x18);
        cdef_sync->cdef_row_mt = pAVar10;
        if (pAVar10 == (AV1CdefRowSync *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_row_mt");
        }
        if (0 < iVar3) {
          lVar17 = 0;
          do {
            pvVar9 = aom_malloc(0x28);
            *(void **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar17) = pvVar9;
            ppVar13 = *(pthread_mutex_t **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar17);
            if (ppVar13 == (pthread_mutex_t *)0x0) {
              aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate (*cdef_row_mt)[row_idx].row_mutex_");
              ppVar13 = *(pthread_mutex_t **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar17);
            }
            pthread_mutex_init(ppVar13,(pthread_mutexattr_t *)0x0);
            pvVar9 = aom_malloc(0x30);
            *(void **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar17) = pvVar9;
            ppVar14 = *(pthread_cond_t **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar17);
            if (ppVar14 == (pthread_cond_t *)0x0) {
              aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate (*cdef_row_mt)[row_idx].row_cond_");
              ppVar14 = *(pthread_cond_t **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar17);
            }
            pthread_cond_init(ppVar14,(pthread_condattr_t *)0x0);
            lVar17 = lVar17 + 0x18;
          } while ((long)iVar3 * 0x18 != lVar17);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_alloc_cdef_buffers(AV1_COMMON *const cm,
                            AV1CdefWorkerData **cdef_worker,
                            AV1CdefSync *cdef_sync, int num_workers,
                            int init_worker) {
  const int num_planes = av1_num_planes(cm);
  size_t new_linebuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_colbuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_srcbuf_size = 0;
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check for configuration change
  const int num_mi_rows =
      (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int is_num_workers_changed =
      cdef_info->allocated_num_workers != num_workers;
  const int is_cdef_enabled =
      cm->seq_params->enable_cdef && !cm->tiles.single_tile_decoding;

  // num-bufs=3 represents ping-pong buffers for top linebuf,
  // followed by bottom linebuf.
  // ping-pong is to avoid top linebuf over-write by consecutive row.
  int num_bufs = 3;
  if (num_workers > 1)
    num_bufs = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  if (is_cdef_enabled) {
    // Calculate src buffer size
    new_srcbuf_size = sizeof(*cdef_info->srcbuf) * CDEF_INBUF_SIZE;
    for (int plane = 0; plane < num_planes; plane++) {
      const int shift =
          plane == AOM_PLANE_Y ? 0 : cm->seq_params->subsampling_x;
      // Calculate top and bottom line buffer size
      const int luma_stride =
          ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
      new_linebuf_size[plane] = sizeof(*cdef_info->linebuf) * num_bufs *
                                (CDEF_VBORDER << 1) * (luma_stride >> shift);
      // Calculate column buffer size
      const int block_height =
          (CDEF_BLOCKSIZE << (MI_SIZE_LOG2 - shift)) * 2 * CDEF_VBORDER;
      new_colbuf_size[plane] =
          sizeof(*cdef_info->colbuf[plane]) * block_height * CDEF_HBORDER;
    }
  }

  // Free src, line and column buffers for worker 0 in case of reallocation
  free_cdef_linebuf_conditional(cm, new_linebuf_size);
  free_cdef_bufs_conditional(cm, cdef_info->colbuf, &cdef_info->srcbuf,
                             new_colbuf_size, new_srcbuf_size);

  // The flag init_worker indicates if cdef_worker has to be allocated for the
  // frame. This is passed as 1 always from decoder. At encoder side, it is 0
  // when called for parallel frames during FPMT (where cdef_worker is shared
  // across parallel frames) and 1 otherwise.
  if (*cdef_worker != NULL && init_worker) {
    if (is_num_workers_changed) {
      // Free src and column buffers for remaining workers in case of change in
      // num_workers
      for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);

      aom_free(*cdef_worker);
      *cdef_worker = NULL;
    } else if (num_workers > 1) {
      // Free src and column buffers for remaining workers in case of
      // reallocation
      for (int idx = num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs_conditional(cm, (*cdef_worker)[idx].colbuf,
                                   &(*cdef_worker)[idx].srcbuf, new_colbuf_size,
                                   new_srcbuf_size);
    }
  }

  if (cdef_info->allocated_mi_rows != num_mi_rows)
    free_cdef_row_sync(&cdef_sync->cdef_row_mt, cdef_info->allocated_mi_rows);

  // Store allocated sizes for reallocation
  cdef_info->allocated_srcbuf_size = new_srcbuf_size;
  av1_copy(cdef_info->allocated_colbuf_size, new_colbuf_size);
  av1_copy(cdef_info->allocated_linebuf_size, new_linebuf_size);
  // Store configuration to check change in configuration
  cdef_info->allocated_mi_rows = num_mi_rows;
  cdef_info->allocated_num_workers = num_workers;

  if (!is_cdef_enabled) return;

  // Memory allocation of column buffer & source buffer (worker_0).
  alloc_cdef_bufs(cm, cdef_info->colbuf, &cdef_info->srcbuf, num_planes);
  alloc_cdef_linebuf(cm, cdef_info->linebuf, num_planes);

  if (num_workers < 2) return;

  if (init_worker) {
    if (*cdef_worker == NULL)
      CHECK_MEM_ERROR(cm, *cdef_worker,
                      aom_calloc(num_workers, sizeof(**cdef_worker)));

    // Memory allocation of column buffer & source buffer for remaining workers.
    for (int idx = num_workers - 1; idx >= 1; idx--)
      alloc_cdef_bufs(cm, (*cdef_worker)[idx].colbuf,
                      &(*cdef_worker)[idx].srcbuf, num_planes);
  }

  alloc_cdef_row_sync(cm, &cdef_sync->cdef_row_mt,
                      cdef_info->allocated_mi_rows);
}